

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.h
# Opt level: O0

void __thiscall board::Board::Board(Board *this)

{
  char *__s;
  allocator<char> local_31;
  string local_30;
  Board *local_10;
  Board *this_local;
  
  local_10 = this;
  std::vector<board::Undo,_std::allocator<board::Undo>_>::vector(&this->history);
  __s = DEFAULT_FEN;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
  parseFen(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

Board()
    {
        parseFen(DEFAULT_FEN);
    }